

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O0

bool __thiscall OpenMD::MoleculeStamp::addBondStamp(MoleculeStamp *this,BondStamp *bond)

{
  value_type *in_RDI;
  vector<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_> *unaff_retaddr;
  
  std::vector<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>::push_back
            (unaff_retaddr,in_RDI);
  return true;
}

Assistant:

bool MoleculeStamp::addBondStamp(BondStamp* bond) {
    bondStamps_.push_back(bond);
    return true;
  }